

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SimpleVolPathIntegrator::Li
          (SimpleVolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *param_5)

{
  float **ppfVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar4;
  ulong uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  bool bVar10;
  ShapeIntersection *pSVar11;
  uint64_t sequenceIndex;
  uint64_t seed;
  ShapeIntersection *pSVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int *piVar22;
  int *piVar23;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar24;
  DenselySampledSpectrum *this_00;
  ulong uVar25;
  LightHandle *light;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this_01;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Float FVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar114 [56];
  undefined1 auVar37 [64];
  undefined1 auVar115 [56];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  float fVar116;
  undefined1 auVar177 [12];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar178 [60];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  float fVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar190;
  undefined1 in_ZMM5 [64];
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar198;
  undefined1 in_ZMM12 [64];
  float fVar199;
  float fVar200;
  undefined1 in_XMM16 [16];
  Vector3<float> VVar201;
  Point3f PVar202;
  Point3<float> PVar203;
  Vector3f woRender;
  anon_class_16_2_2793a994 func;
  SampledSpectrum SVar204;
  bool terminated;
  bool scattered;
  undefined1 local_4f8 [16];
  float local_4e0;
  Float tMax;
  Float tMin;
  float local_4d4;
  int voxel [3];
  float nextCrossingT [3];
  SampledSpectrum sigma_a_1;
  float local_498;
  float fStack_494;
  Float local_490;
  MediumHandle local_488;
  Tuple3<pbrt::Vector3,_float> *local_480;
  undefined1 local_478 [16];
  Transform *local_468;
  TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
  *local_460;
  Tuple3<pbrt::Point3,_float> local_458;
  int numScatters;
  undefined1 local_448 [16];
  SampledSpectrum sigma_maj;
  undefined1 local_428 [36];
  int voxelLimit [3];
  int step [3];
  float deltaT [3];
  Ray ray_1;
  SampledSpectrum sigma_s;
  PhaseFunctionHandle local_3a0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_398;
  Tuple3<pbrt::Vector3,_float> local_390;
  Tuple3<pbrt::Point3,_float> local_380;
  SampledSpectrum sigma_a;
  SampledSpectrum density;
  anon_class_72_9_b858679e local_350;
  BSDF bsdf;
  SampledSpectrum L;
  RNG rng;
  SampledSpectrum Le;
  SampledSpectrum sigma_t;
  SampledSpectrum beta;
  SampledSpectrum local_1f8;
  MediumInteraction intr;
  undefined8 local_148;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_140;
  optional<pbrt::ShapeIntersection> si;
  undefined1 extraout_var [60];
  undefined8 uVar113;
  undefined1 extraout_var_00 [56];
  
  SampledSpectrum::SampledSpectrum(&L,0.0);
  SampledSpectrum::SampledSpectrum(&beta,1.0);
  numScatters = 0;
  SampledWavelengths::TerminateSecondary(lambda);
  local_480 = &(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>;
  local_460 = (TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               *)sampler;
  do {
    auVar36 = ZEXT464(0x7f800000);
    Integrator::Intersect(&si,(Integrator *)this,&ray->super_Ray,INFINITY);
    auVar114 = in_ZMM1._8_56_;
    scattered = false;
    terminated = false;
    if (((ray->super_Ray).medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits & 0xffffffffffff) != 0) {
      local_4f8._0_4_ = 0x7f800000;
      if (si.set == true) {
        pSVar11 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
        local_4f8._0_4_ = pSVar11->tHit;
      }
      FVar29 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                           *)sampler);
      sequenceIndex = Hash<float>(FVar29);
      FVar29 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>(local_460);
      seed = Hash<float>(FVar29);
      RNG::SetSequence(&rng,sequenceIndex,seed);
      uVar25 = (ray->super_Ray).medium.
               super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               .bits;
      this_00 = (DenselySampledSpectrum *)(uVar25 & 0xffffffffffff);
      local_350.lambda = lambda;
      local_350.this = this;
      local_350.ray = ray;
      if (uVar25 < 0x3000000000000) {
        if ((uVar25 & 0x3000000000000) == 0x2000000000000) {
          local_428._0_8_ = uVar25;
          local_350.L = &L;
          local_350.sampler = (SamplerHandle *)local_460;
          local_350.terminated = &terminated;
          local_350.numScatters = &numScatters;
          local_350.beta = &beta;
          local_350.scattered = &scattered;
          fVar31 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar28 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar31)),auVar28,auVar28);
          auVar178 = ZEXT1260(auVar28._4_12_);
          auVar26 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar28 = vfmadd213ss_fma(auVar26,auVar26,auVar28);
          auVar28 = vsqrtss_avx(auVar28,auVar28);
          local_4d4 = auVar28._0_4_ * (float)local_4f8._0_4_;
          auVar114 = (undefined1  [56])0x0;
          VVar201 = Normalize<float>((Vector3<float> *)local_480);
          in_ZMM1._0_4_ = VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
          in_ZMM1._4_60_ = auVar178;
          auVar37._0_8_ = VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar37._8_56_ = auVar114;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          bsdf.eta = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          bsdf._4_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          uVar113 = vmovlps_avx(auVar37._0_16_);
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._4_4_ = (float)uVar113;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar113 >> 0x20)
          ;
          bsdf.shadingFrame._8_8_ = bsdf.shadingFrame._8_8_ & 0xffffffff00000000;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = in_ZMM1._0_4_;
          Transform::operator()(&ray_1,(Transform *)(this_00 + 3),(Ray *)&bsdf,&local_4d4);
          auVar36 = ZEXT464((uint)local_4d4);
          bVar10 = Bounds3<float>::IntersectP
                             ((Bounds3<float> *)&this_00->values,&ray_1.o,&ray_1.d,local_4d4,&tMin,
                              &tMax);
          auVar28 = in_ZMM5._0_16_;
          auVar114 = in_ZMM1._8_56_;
          if (bVar10) {
            auVar115 = (undefined1  [56])0x0;
            local_4f8._0_4_ = *(Float *)&this_00[2].values.nStored;
            SVar204 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_00->values).nStored,lambda);
            auVar120._0_8_ = SVar204.values.values._8_8_;
            auVar120._8_56_ = auVar114;
            auVar38._0_8_ = SVar204.values.values._0_8_;
            auVar38._8_56_ = auVar115;
            auVar26 = vmovlhps_avx(auVar38._0_16_,auVar120._0_16_);
            bsdf._0_8_ = auVar26._0_8_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._0_4_ = auVar26._8_4_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._4_4_ = auVar26._12_4_;
            auVar115 = (undefined1  [56])0x0;
            SVar204 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_4f8._0_4_);
            auVar121._0_8_ = SVar204.values.values._8_8_;
            auVar121._8_56_ = auVar114;
            auVar39._0_8_ = SVar204.values.values._0_8_;
            auVar39._8_56_ = auVar115;
            sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar39._0_16_,auVar121._0_16_);
            local_4f8._0_4_ = *(undefined4 *)&this_00[2].values.nStored;
            auVar115 = (undefined1  [56])0x0;
            SVar204 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_00[1].values.nStored,lambda);
            auVar122._0_8_ = SVar204.values.values._8_8_;
            auVar122._8_56_ = auVar114;
            auVar40._0_8_ = SVar204.values.values._0_8_;
            auVar40._8_56_ = auVar115;
            auVar26 = vmovlhps_avx(auVar40._0_16_,auVar122._0_16_);
            bsdf._0_8_ = auVar26._0_8_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._0_4_ = auVar26._8_4_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._4_4_ = auVar26._12_4_;
            auVar115 = (undefined1  [56])0x0;
            SVar204 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_4f8._0_4_);
            auVar123._0_8_ = SVar204.values.values._8_8_;
            auVar123._8_56_ = auVar114;
            auVar41._0_8_ = SVar204.values.values._0_8_;
            auVar41._8_56_ = auVar115;
            sigma_s.values.values = (array<float,_4>)vmovlhps_avx(auVar41._0_16_,auVar123._0_16_);
            auVar115 = ZEXT856(sigma_s.values.values._8_8_);
            SVar204 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
            auVar124._0_8_ = SVar204.values.values._8_8_;
            auVar124._8_56_ = auVar114;
            auVar42._0_8_ = SVar204.values.values._0_8_;
            auVar42._8_56_ = auVar115;
            sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar42._0_16_,auVar124._0_16_);
            auVar114 = ZEXT856(sigma_t.values.values._8_8_);
            VVar201 = Bounds3<float>::Diagonal((Bounds3<float> *)&this_00->values);
            auVar125._4_60_ = auVar124._4_60_;
            auVar125._0_4_ = VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar43._0_8_ = VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar43._8_56_ = auVar114;
            auVar180._4_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.z;
            auVar180._0_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.y;
            auVar180._8_8_ = 0;
            auVar184._8_8_ = 0;
            auVar184._0_8_ = *(ulong *)((long)&(this_00->values).alloc.memoryResource + 4);
            auVar26 = vsubps_avx(auVar180,auVar184);
            auVar26 = vpermt2ps_avx512vl(auVar26,_DAT_00596440,
                                         ZEXT416((uint)(ray_1.o.super_Tuple3<pbrt::Point3,_float>.x
                                                       - *(float *)&(this_00->values).alloc.
                                                                    memoryResource)));
            auVar26 = vinsertps_avx(auVar26,ZEXT416((uint)ray_1.d.super_Tuple3<pbrt::Vector3,_float>
                                                          .x),0x30);
            auVar27 = vpermt2ps_avx512vl(auVar43._0_16_,_DAT_00596450,auVar125._0_16_);
            auVar185._4_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar185._0_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar185._8_8_ = 0;
            sigma_a_1.values.values = (array<float,_4>)vdivps_avx(auVar26,auVar27);
            auVar26 = vpermt2ps_avx512vl(auVar43._0_16_,ZEXT816(0x400000001),auVar125._0_16_);
            auVar26 = vdivps_avx(auVar185,auVar26);
            _local_498 = vmovlps_avx(auVar26);
            auVar114 = (undefined1  [56])0x0;
            local_490 = 0.0;
            local_488.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     )0;
            PVar202 = Ray::operator()((Ray *)&sigma_a_1,tMin);
            fVar116 = PVar202.super_Tuple3<pbrt::Point3,_float>.z;
            auVar44._0_8_ = PVar202.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar44._8_56_ = auVar114;
            auVar26 = vpcmpeqd_avx(auVar28,auVar28);
            ppfVar1 = &this_00[10].values.ptr;
            auVar189 = ZEXT816(0) << 0x40;
            lVar21 = 0;
            local_478._0_8_ = ppfVar1;
            iVar19 = *(int *)&this_00[10].values.ptr;
            auVar181._8_8_ = 0;
            auVar181._0_8_ = this_00[10].values.alloc.memoryResource;
            auVar28 = vcvtdq2ps_avx(auVar181);
            auVar26 = vpaddd_avx(auVar181,auVar26);
            auVar26 = vcvtdq2ps_avx(auVar26);
            fVar31 = auVar28._0_4_;
            fVar30 = PVar202.super_Tuple3<pbrt::Point3,_float>.x;
            auVar192._0_4_ = fVar30 * fVar31;
            auVar192._4_4_ = PVar202.super_Tuple3<pbrt::Point3,_float>.y * auVar28._4_4_;
            auVar192._8_4_ = auVar114._0_4_ * auVar28._8_4_;
            auVar192._12_4_ = auVar114._4_4_ * auVar28._12_4_;
            auVar28 = vmovshdup_avx(auVar28);
            fVar190 = 1.0 / fVar31;
            in_ZMM5 = ZEXT464((uint)fVar190);
            auVar27 = vmovshdup_avx(auVar26);
            uVar6 = vcmpps_avx512vl(auVar26,auVar192,1);
            auVar188 = vmovshdup_avx(auVar192);
            uVar113 = vcmpss_avx512f(auVar188,auVar189,1);
            bVar9 = (byte)(uVar6 >> 1);
            fVar179 = (float)iVar19;
            uVar7 = vcmpss_avx512f(auVar192,auVar189,1);
            iVar17 = (int)(float)((uint)!(bool)((byte)uVar113 & 1) *
                                 ((uint)(bVar9 & 1) * auVar27._0_4_ +
                                 (uint)!(bool)(bVar9 & 1) * auVar188._0_4_));
            iVar18 = (int)(float)((uint)!(bool)((byte)uVar7 & 1) *
                                 ((uint)((byte)uVar6 & 1) * auVar26._0_4_ +
                                 (uint)!(bool)((byte)uVar6 & 1) * (int)auVar192._0_4_));
            auVar193._0_4_ = (float)(iVar19 + -1);
            auVar193._4_12_ = in_ZMM12._4_12_;
            fVar191 = auVar28._0_4_;
            auVar28 = vminss_avx(auVar193,ZEXT416((uint)(fVar116 * fVar179)));
            uVar113 = vcmpss_avx512f(ZEXT416((uint)(fVar116 * fVar179)),auVar189,1);
            auVar26 = vmovshdup_avx(auVar44._0_16_);
            iVar19 = (int)(float)((uint)!(bool)((byte)uVar113 & 1) * auVar28._0_4_);
            local_4f8._0_4_ = tMin;
            for (; lVar21 != 3; lVar21 = lVar21 + 1) {
              pfVar13 = sigma_a_1.values.values + 3;
              iVar20 = (int)lVar21;
              if ((iVar20 != 0) && (pfVar13 = &local_498, iVar20 != 1)) {
                pfVar13 = &fStack_494;
              }
              if ((*pfVar13 == 0.0) && (!NAN(*pfVar13))) {
                pfVar13 = sigma_a_1.values.values + 3;
                if ((iVar20 != 0) && (pfVar13 = &local_498, iVar20 != 1)) {
                  pfVar13 = &fStack_494;
                }
                *pfVar13 = 0.0;
              }
              if (iVar20 == 1) {
                voxel[1] = iVar17;
                piVar22 = voxelLimit + 1;
                piVar23 = step + 1;
                pfVar15 = deltaT + 1;
                pfVar13 = nextCrossingT + 1;
                pfVar14 = &local_498;
                iVar16 = iVar17;
              }
              else if (iVar20 == 0) {
                voxel[lVar21] = iVar18;
                piVar22 = voxelLimit;
                piVar23 = step;
                pfVar15 = deltaT;
                pfVar13 = nextCrossingT;
                pfVar14 = sigma_a_1.values.values + 3;
                iVar16 = iVar18;
              }
              else {
                piVar22 = voxelLimit + 2;
                piVar23 = step + 2;
                pfVar15 = deltaT + 2;
                pfVar13 = nextCrossingT + 2;
                pfVar14 = &fStack_494;
                voxel[lVar21] = iVar19;
                iVar16 = iVar19;
              }
              if (0.0 <= *pfVar14) {
                pfVar14 = sigma_a_1.values.values + 3;
                pvVar24 = &this_00[10].values;
                fVar198 = fVar31;
                fVar199 = fVar30;
                fVar200 = fVar190;
                if ((iVar20 != 0) &&
                   (pfVar14 = &local_498,
                   pvVar24 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                             ((long)&this_00[10].values.alloc.memoryResource + 4), fVar198 = fVar191
                   , fVar199 = auVar26._0_4_, fVar200 = 1.0 / fVar191, iVar20 != 1)) {
                  pfVar14 = &fStack_494;
                  pvVar24 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar1;
                  fVar198 = fVar179;
                  fVar199 = fVar116;
                  fVar200 = 1.0 / fVar179;
                }
                *piVar23 = 1;
                auVar28 = vcvtsi2ss_avx512f(in_XMM16,iVar16 + 1);
                fVar2 = *pfVar14;
                *pfVar15 = fVar200 / fVar2;
                *pfVar13 = (auVar28._0_4_ / fVar198 - fVar199) / fVar2 + tMin;
                iVar20 = *(int *)&(pvVar24->alloc).memoryResource;
              }
              else {
                pfVar14 = sigma_a_1.values.values + 3;
                fVar198 = fVar31;
                fVar199 = fVar30;
                fVar200 = -fVar190;
                if ((iVar20 != 0) &&
                   (pfVar14 = &local_498, fVar198 = fVar191, fVar199 = auVar26._0_4_,
                   fVar200 = -(1.0 / fVar191), iVar20 != 1)) {
                  pfVar14 = &fStack_494;
                  fVar198 = fVar179;
                  fVar199 = fVar116;
                  fVar200 = -(1.0 / fVar179);
                }
                auVar28 = vcvtsi2ss_avx512f(in_XMM16,iVar16);
                *piVar23 = -1;
                fVar2 = *pfVar14;
                *pfVar15 = fVar200 / fVar2;
                *pfVar13 = (auVar28._0_4_ / fVar198 - fVar199) / fVar2 + tMin;
                iVar20 = -1;
              }
              in_ZMM12 = ZEXT464(0);
              *piVar22 = iVar20;
            }
            fVar31 = RNG::Uniform<float>(&rng);
            local_448._0_4_ = fVar31;
            do {
              auVar115 = (undefined1  [56])0x0;
              iVar19 = *(int *)(&DAT_00596420 +
                               (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                      (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                      (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
              local_468 = (Transform *)CONCAT44(local_468._4_4_,nextCrossingT[iVar19]);
              auVar114 = (undefined1  [56])0x0;
              SVar204 = SampledSpectrum::operator*
                                  (&sigma_t,*(Float *)(this_00[9].values.nAlloc +
                                                      (((long)voxel[2] *
                                                        (long)*(int *)((long)&this_00[10].values.
                                                                              alloc.memoryResource +
                                                                      4) + (long)voxel[1]) *
                                                       (long)*(int *)&this_00[10].values.alloc.
                                                                      memoryResource +
                                                      (long)voxel[0]) * 4));
              auVar146._0_8_ = SVar204.values.values._8_8_;
              auVar146._8_56_ = auVar115;
              auVar71._0_8_ = SVar204.values.values._0_8_;
              auVar71._8_56_ = auVar114;
              auVar36 = ZEXT1664(auVar71._0_16_);
              sigma_maj.values.values =
                   (array<float,_4>)vmovlhps_avx(auVar71._0_16_,auVar146._0_16_);
              if (SVar204.values.values[0] <= 0.0) {
                in_ZMM1 = ZEXT464((uint)local_448._0_4_);
              }
              else {
                fVar31 = (float)local_4f8._0_4_;
LAB_00430074:
                local_4f8._0_4_ = fVar31;
                FVar29 = InvertExponentialSample(local_468._0_4_ - fVar31,auVar36._0_4_);
                if ((float)local_448._0_4_ < FVar29) {
                  in_ZMM1 = ZEXT464((uint)sigma_maj.values.values[0]);
                  FVar29 = SampleExponential((Float)local_448._0_4_,sigma_maj.values.values[0]);
                  auVar26 = in_ZMM12._0_16_;
                  auVar28 = in_ZMM5._0_16_;
                  auVar115 = in_ZMM1._8_56_;
                  fVar31 = FVar29 + (float)local_4f8._0_4_;
                  auVar114 = (undefined1  [56])0x0;
                  if (tMax <= fVar31) {
                    SampledSpectrum::SampledSpectrum((SampledSpectrum *)&intr,1.0);
                    auVar36 = ZEXT1664((undefined1  [16])
                                       intr.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_);
                    Li::anon_class_72_9_b858679e::operator()(&local_350,(MediumSample *)&bsdf);
LAB_00430e0a:
                    pstd::optional<pbrt::MediumInteraction>::~optional
                              ((optional<pbrt::MediumInteraction> *)&bsdf);
                  }
                  else {
                    local_478._0_4_ = fVar31;
                    PVar202 = Ray::operator()(&ray_1,fVar31);
                    local_458.z = PVar202.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar72._0_8_ = PVar202.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    auVar72._8_56_ = auVar114;
                    local_458._0_8_ = vmovlps_avx(auVar72._0_16_);
                    SVar204 = SampledSpectrum::operator-(&sigma_maj);
                    auVar147._0_8_ = SVar204.values.values._8_8_;
                    auVar147._8_56_ = auVar115;
                    auVar73._0_8_ = SVar204.values.values._0_8_;
                    auVar73._8_56_ = auVar114;
                    intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                         vmovlhps_avx(auVar73._0_16_,auVar147._0_16_);
                    auVar114 = (undefined1  [56])0x0;
                    SVar204 = SampledSpectrum::operator*
                                        ((SampledSpectrum *)&intr,
                                         (float)local_478._0_4_ - (float)local_4f8._0_4_);
                    auVar148._0_8_ = SVar204.values.values._8_8_;
                    auVar148._8_56_ = auVar115;
                    auVar74._0_8_ = SVar204.values.values._0_8_;
                    auVar74._8_56_ = auVar114;
                    auVar27 = vmovlhps_avx(auVar74._0_16_,auVar148._0_16_);
                    auVar114 = ZEXT856(auVar27._8_8_);
                    bsdf._0_8_ = auVar27._0_8_;
                    bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits._0_4_ = auVar27._8_4_;
                    bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits._4_4_ = auVar27._12_4_;
                    SVar204 = FastExp((SampledSpectrum *)&bsdf);
                    auVar149._0_8_ = SVar204.values.values._8_8_;
                    auVar149._8_56_ = auVar115;
                    auVar75._0_8_ = SVar204.values.values._0_8_;
                    auVar75._8_56_ = auVar114;
                    local_4f8 = auVar75._0_16_;
                    local_448 = auVar149._0_16_;
                    SVar204 = UniformGridMediumProvider::Density
                                        (*(UniformGridMediumProvider **)this_00,
                                         (Point3f *)&local_458,lambda);
                    auVar150._0_8_ = SVar204.values.values._8_8_;
                    auVar150._8_56_ = auVar115;
                    auVar76._0_8_ = SVar204.values.values._0_8_;
                    auVar76._8_56_ = auVar114;
                    density.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar76._0_16_,auVar150._0_16_);
                    auVar114 = ZEXT856(density.values.values._8_8_);
                    SVar204 = UniformGridMediumProvider::Le
                                        (*(UniformGridMediumProvider **)this_00,
                                         (Point3f *)&local_458,lambda);
                    auVar151._0_8_ = SVar204.values.values._8_8_;
                    auVar151._8_56_ = auVar115;
                    auVar77._0_8_ = SVar204.values.values._0_8_;
                    auVar77._8_56_ = auVar114;
                    Le.values.values = (array<float,_4>)vmovlhps_avx(auVar77._0_16_,auVar151._0_16_)
                    ;
                    auVar114 = ZEXT856(Le.values.values._8_8_);
                    PVar203 = Transform::operator()
                                        ((Transform *)&this_00[6].values,(Point3<float> *)&local_458
                                        );
                    uVar113 = auVar114._0_8_;
                    auVar177 = auVar151._4_12_;
                    local_380.z = PVar203.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar78._0_8_ = PVar203.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    auVar78._8_56_ = auVar114;
                    local_380._0_8_ = vmovlps_avx(auVar78._0_16_);
                    VVar201 = Normalize<float>((Vector3<float> *)local_480);
                    auVar33._0_8_ =
                         VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    auVar33._8_4_ = (uint)uVar113 ^ 0x80000000;
                    auVar33._12_4_ = (uint)((ulong)uVar113 >> 0x20) ^ 0x80000000;
                    local_390.z = -VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar117._0_8_ =
                         CONCAT44(auVar177._0_4_,VVar201.super_Tuple3<pbrt::Vector3,_float>.z) ^
                         0x8000000080000000;
                    auVar117._8_4_ = auVar177._4_4_ ^ 0x80000000;
                    auVar117._12_4_ = auVar177._8_4_ ^ 0x80000000;
                    auVar115 = ZEXT856(auVar117._8_8_);
                    local_390._0_8_ = vmovlps_avx(auVar33);
                    local_4e0 = (ray->super_Ray).time;
                    auVar114 = (undefined1  [56])0x0;
                    SVar204 = SampledSpectrum::operator*(&sigma_a,&density);
                    auVar152._0_8_ = SVar204.values.values._8_8_;
                    auVar152._8_56_ = auVar115;
                    auVar79._0_8_ = SVar204.values.values._0_8_;
                    auVar79._8_56_ = auVar114;
                    auVar27 = vmovlhps_avx(auVar79._0_16_,auVar152._0_16_);
                    auVar114 = ZEXT856(auVar27._8_8_);
                    bsdf._0_8_ = auVar27._0_8_;
                    bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits._0_4_ = auVar27._8_4_;
                    bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits._4_4_ = auVar27._12_4_;
                    SVar204 = SampledSpectrum::operator*(&sigma_s,&density);
                    auVar153._0_8_ = SVar204.values.values._8_8_;
                    auVar153._8_56_ = auVar115;
                    auVar80._0_8_ = SVar204.values.values._0_8_;
                    auVar80._8_56_ = auVar114;
                    local_1f8.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar80._0_16_,auVar153._0_16_);
                    local_3a0.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                         (TaggedPointer<pbrt::HGPhaseFunction>)
                         (TaggedPointer<pbrt::HGPhaseFunction>)
                         ((ulong)((long)&this_00[2].values.nStored + 4U) | 0x1000000000000);
                    local_398.bits = uVar25;
                    MediumInteraction::MediumInteraction
                              (&intr,(Point3f *)&local_380,(Vector3f *)&local_390,local_4e0,
                               (SampledSpectrum *)&bsdf,&local_1f8,&sigma_maj,&Le,
                               (MediumHandle *)&local_398,&local_3a0);
                    auVar188 = (undefined1  [16])
                               intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_;
                    bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x =
                         intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
                    bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z =
                         intr.super_Interaction.time;
                    bsdf.eta = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                    bsdf._4_4_ = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                    bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits._0_4_ = auVar188._8_4_;
                    bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits._4_4_ = auVar188._12_4_;
                    bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                    bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                    bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
                         intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                    bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z =
                         intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                    bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x =
                         intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
                    bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y =
                         intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
                    bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z =
                         intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
                    bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x =
                         intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
                    bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y =
                         intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
                    bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z =
                         (float)intr.super_Interaction._60_4_;
                    auVar27 = vunpcklpd_avx(local_4f8,local_448);
                    auVar36 = ZEXT1664(auVar27);
                    in_ZMM1 = ZEXT1664((undefined1  [16])intr._72_16_);
                    in_ZMM5 = ZEXT1664(auVar28);
                    in_ZMM12 = ZEXT1664(auVar26);
                    intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = auVar188;
                    bVar10 = Li::anon_class_72_9_b858679e::operator()
                                       (&local_350,(MediumSample *)&bsdf);
                    pstd::optional<pbrt::MediumInteraction>::~optional
                              ((optional<pbrt::MediumInteraction> *)&bsdf);
                    if (bVar10) goto LAB_0043034c;
                  }
                  break;
                }
                auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                     ZEXT416((uint)(((float)local_448._0_4_ - FVar29) /
                                                   (1.0 - FVar29))));
                in_ZMM1 = ZEXT1664(auVar28);
              }
              auVar36 = ZEXT464((uint)local_468._0_4_);
              if ((tMax < local_468._0_4_) ||
                 (iVar17 = voxel[iVar19], voxel[iVar19] = iVar17 + step[iVar19],
                 iVar17 + step[iVar19] == voxelLimit[iVar19])) break;
              local_448._0_4_ = in_ZMM1._0_4_;
              local_4f8._0_4_ = local_468._0_4_;
              nextCrossingT[iVar19] = local_468._0_4_ + deltaT[iVar19];
            } while( true );
          }
        }
        else {
          local_350.L = &L;
          local_350.sampler = (SamplerHandle *)local_460;
          local_350.terminated = &terminated;
          local_350.numScatters = &numScatters;
          local_350.beta = &beta;
          local_350.scattered = &scattered;
          fVar31 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          local_428._0_4_ = fVar31;
          local_4e0 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar115 = (undefined1  [56])0x0;
          local_448._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          VVar201 = Normalize<float>((Vector3<float> *)local_480);
          ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z =
               VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar53._0_8_ = VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar53._8_56_ = auVar115;
          ray_1.o.super_Tuple3<pbrt::Point3,_float>.z =
               (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          uVar3 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          uVar5 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          uVar113 = vmovlps_avx(auVar53._0_16_);
          ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar113;
          ray_1.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar113 >> 0x20);
          ray_1.time = 0.0;
          ray_1.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                   )0;
          auVar115 = (undefined1  [56])0x0;
          ray_1.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar3;
          ray_1.o.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar5;
          local_478._0_4_ = this_00[3].lambda_min;
          SVar204 = DenselySampledSpectrum::Sample(this_00,lambda);
          auVar132._0_8_ = SVar204.values.values._8_8_;
          auVar132._8_56_ = auVar114;
          auVar54._0_8_ = SVar204.values.values._0_8_;
          auVar54._8_56_ = auVar115;
          auVar28 = vmovlhps_avx(auVar54._0_16_,auVar132._0_16_);
          bsdf._0_8_ = auVar28._0_8_;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._0_4_ = auVar28._8_4_;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._4_4_ = auVar28._12_4_;
          auVar115 = (undefined1  [56])0x0;
          SVar204 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_478._0_4_);
          auVar133._0_8_ = SVar204.values.values._8_8_;
          auVar133._8_56_ = auVar114;
          auVar55._0_8_ = SVar204.values.values._0_8_;
          auVar55._8_56_ = auVar115;
          sigma_a_1.values.values = (array<float,_4>)vmovlhps_avx(auVar55._0_16_,auVar133._0_16_);
          auVar115 = (undefined1  [56])0x0;
          local_478._0_4_ = this_00[3].lambda_min;
          SVar204 = DenselySampledSpectrum::Sample(this_00 + 1,lambda);
          auVar134._0_8_ = SVar204.values.values._8_8_;
          auVar134._8_56_ = auVar114;
          auVar56._0_8_ = SVar204.values.values._0_8_;
          auVar56._8_56_ = auVar115;
          auVar28 = vmovlhps_avx(auVar56._0_16_,auVar134._0_16_);
          bsdf._0_8_ = auVar28._0_8_;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._0_4_ = auVar28._8_4_;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._4_4_ = auVar28._12_4_;
          auVar115 = (undefined1  [56])0x0;
          SVar204 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_478._0_4_);
          auVar135._0_8_ = SVar204.values.values._8_8_;
          auVar135._8_56_ = auVar114;
          auVar57._0_8_ = SVar204.values.values._0_8_;
          auVar57._8_56_ = auVar115;
          sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar57._0_16_,auVar135._0_16_);
          auVar115 = ZEXT856(sigma_a.values.values._8_8_);
          SVar204 = SampledSpectrum::operator+(&sigma_a_1,&sigma_a);
          auVar136._0_8_ = SVar204.values.values._8_8_;
          auVar136._8_56_ = auVar114;
          auVar36._0_8_ = SVar204.values.values._0_8_;
          auVar36._8_56_ = auVar115;
          sigma_s.values.values = (array<float,_4>)vmovlhps_avx(auVar36._0_16_,auVar136._0_16_);
          in_ZMM1 = ZEXT1664((undefined1  [16])sigma_s.values.values);
          if ((SVar204.values.values[0] != 0.0) || (NAN(SVar204.values.values[0]))) {
            local_478 = auVar36._0_16_;
            fVar30 = RNG::Uniform<float>(&rng);
            auVar58._0_4_ = SampleExponential(fVar30,(Float)local_478._0_4_);
            auVar27 = in_ZMM12._0_16_;
            auVar26 = in_ZMM5._0_16_;
            auVar58._4_60_ = extraout_var;
            auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31),
                                      ZEXT416((uint)(local_4e0 * local_4e0)));
            auVar114 = ZEXT856(auVar28._8_8_);
            auVar28 = vfmadd213ss_fma(ZEXT416((uint)local_448._0_4_),ZEXT416((uint)local_448._0_4_),
                                      auVar28);
            auVar28 = vsqrtss_avx(auVar28,auVar28);
            fVar31 = auVar28._0_4_ * (float)local_4f8._0_4_;
            if (fVar31 <= auVar58._0_4_) {
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar28 = vxorps_avx512vl(ZEXT416((uint)fVar31),auVar28);
              auVar115 = ZEXT856(auVar28._8_8_);
              SVar204 = SampledSpectrum::operator*(&sigma_s,auVar28._0_4_);
              auVar170._0_8_ = SVar204.values.values._8_8_;
              auVar170._8_56_ = auVar114;
              auVar101._0_8_ = SVar204.values.values._0_8_;
              auVar101._8_56_ = auVar115;
              intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                   vmovlhps_avx(auVar101._0_16_,auVar170._0_16_);
              auVar115 = ZEXT856(intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
              SVar204 = FastExp((SampledSpectrum *)&intr);
              in_ZMM1._0_8_ = SVar204.values.values._8_8_;
              in_ZMM1._8_56_ = auVar114;
              auVar102._0_8_ = SVar204.values.values._0_8_;
              auVar102._8_56_ = auVar115;
              auVar28 = vmovlhps_avx(auVar102._0_16_,in_ZMM1._0_16_);
              auVar36 = ZEXT1664(auVar28);
              Li::anon_class_72_9_b858679e::operator()(&local_350,(MediumSample *)&bsdf);
            }
            else {
              auVar8._8_4_ = 0x80000000;
              auVar8._0_8_ = 0x8000000080000000;
              auVar8._12_4_ = 0x80000000;
              auVar28 = vxorps_avx512vl(auVar58._0_16_,auVar8);
              auVar115 = ZEXT856(auVar28._8_8_);
              local_4f8 = auVar58._0_16_;
              SVar204 = SampledSpectrum::operator*(&sigma_s,auVar28._0_4_);
              auVar137._0_8_ = SVar204.values.values._8_8_;
              auVar137._8_56_ = auVar114;
              auVar59._0_8_ = SVar204.values.values._0_8_;
              auVar59._8_56_ = auVar115;
              auVar28 = vmovlhps_avx(auVar59._0_16_,auVar137._0_16_);
              auVar115 = ZEXT856(auVar28._8_8_);
              bsdf._0_8_ = auVar28._0_8_;
              bsdf.bxdf.
              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
              .bits._0_4_ = auVar28._8_4_;
              bsdf.bxdf.
              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
              .bits._4_4_ = auVar28._12_4_;
              SVar204 = FastExp((SampledSpectrum *)&bsdf);
              auVar138._0_8_ = SVar204.values.values._8_8_;
              auVar138._8_56_ = auVar114;
              auVar60._0_8_ = SVar204.values.values._0_8_;
              auVar60._8_56_ = auVar115;
              local_478 = auVar60._0_16_;
              local_428._0_16_ = auVar138._0_16_;
              SVar204 = DenselySampledSpectrum::Sample(this_00 + 2,lambda);
              auVar139._0_8_ = SVar204.values.values._8_8_;
              auVar139._8_56_ = auVar114;
              auVar61._0_8_ = SVar204.values.values._0_8_;
              auVar61._8_56_ = auVar115;
              sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar61._0_16_,auVar139._0_16_);
              auVar114 = ZEXT856((ulong)local_4f8._8_8_);
              PVar202 = Ray::operator()(&ray_1,local_4f8._0_4_);
              bsdf.bxdf.
              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
              .bits._0_4_ = PVar202.super_Tuple3<pbrt::Point3,_float>.z;
              auVar62._0_8_ = PVar202.super_Tuple3<pbrt::Point3,_float>._0_8_;
              auVar62._8_56_ = auVar114;
              bsdf._0_8_ = vmovlps_avx(auVar62._0_16_);
              uVar25 = (ulong)&this_00[3].lambda_max | 0x1000000000000;
              auVar32._0_8_ =
                   CONCAT44(ray_1.d.super_Tuple3<pbrt::Vector3,_float>.y,
                            ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x) ^ 0x8000000080000000;
              auVar32._8_4_ = 0x80000000;
              auVar32._12_4_ = 0x80000000;
              uVar113 = vmovlps_avx(auVar32);
              sigma_maj.values.values[2] = -ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z;
              sigma_maj.values.values[0] = (float)(int)uVar113;
              sigma_maj.values.values[1] = (float)(int)((ulong)uVar113 >> 0x20);
              density.values.values[0] = (float)(int)((ulong)this_00 | 0x1000000000000);
              density.values.values[1] = (float)(int)(((ulong)this_00 | 0x1000000000000) >> 0x20);
              Le.values.values[0] = (float)(int)uVar25;
              Le.values.values[1] = (float)(int)(uVar25 >> 0x20);
              MediumInteraction::MediumInteraction
                        (&intr,(Point3f *)&bsdf,(Vector3f *)&sigma_maj,(ray->super_Ray).time,
                         &sigma_a_1,&sigma_a,&sigma_s,&sigma_t,(MediumHandle *)&density,
                         (PhaseFunctionHandle *)&Le);
              auVar188 = (undefined1  [16])
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_;
              bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x =
                   intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
              bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = intr.super_Interaction.time
              ;
              bsdf.eta = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
              bsdf._4_4_ = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
              bsdf.bxdf.
              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
              .bits._0_4_ = auVar188._8_4_;
              bsdf.bxdf.
              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
              .bits._4_4_ = auVar188._12_4_;
              bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x =
                   intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
              bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y =
                   intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
              bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
                   intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
              bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z =
                   intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
              bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x =
                   intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
              bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y =
                   intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
              bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z =
                   intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
              bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x =
                   intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
              bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y =
                   intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
              bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z = (float)intr.super_Interaction._60_4_;
              auVar28 = vunpcklpd_avx(local_478,local_428._0_16_);
              auVar36 = ZEXT1664(auVar28);
              in_ZMM1 = ZEXT1664((undefined1  [16])intr._72_16_);
              in_ZMM5 = ZEXT1664(auVar26);
              in_ZMM12 = ZEXT1664(auVar27);
              intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = auVar188;
              Li::anon_class_72_9_b858679e::operator()(&local_350,(MediumSample *)&bsdf);
            }
            pstd::optional<pbrt::MediumInteraction>::~optional
                      ((optional<pbrt::MediumInteraction> *)&bsdf);
          }
        }
      }
      else {
        local_428._0_8_ = uVar25;
        if ((uVar25 & 0xfffe000000000000) == 0x2000000000000) {
          local_350.L = &L;
          local_350.sampler = (SamplerHandle *)local_460;
          local_350.terminated = &terminated;
          local_350.numScatters = &numScatters;
          local_350.beta = &beta;
          local_350.scattered = &scattered;
          fVar31 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar28 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar31)),auVar28,auVar28);
          auVar178 = ZEXT1260(auVar28._4_12_);
          auVar26 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar28 = vfmadd213ss_fma(auVar26,auVar26,auVar28);
          auVar28 = vsqrtss_avx(auVar28,auVar28);
          local_4d4 = auVar28._0_4_ * (float)local_4f8._0_4_;
          auVar114 = (undefined1  [56])0x0;
          VVar201 = Normalize<float>((Vector3<float> *)local_480);
          in_ZMM1._0_4_ = VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
          in_ZMM1._4_60_ = auVar178;
          auVar45._0_8_ = VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar45._8_56_ = auVar114;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          bsdf.eta = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          bsdf._4_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          uVar113 = vmovlps_avx(auVar45._0_16_);
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._4_4_ = (float)uVar113;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar113 >> 0x20)
          ;
          bsdf.shadingFrame._8_8_ = bsdf.shadingFrame._8_8_ & 0xffffffff00000000;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = in_ZMM1._0_4_;
          Transform::operator()(&ray_1,(Transform *)(this_00 + 3),(Ray *)&bsdf,&local_4d4);
          auVar36 = ZEXT464((uint)local_4d4);
          bVar10 = Bounds3<float>::IntersectP
                             ((Bounds3<float> *)&this_00->values,&ray_1.o,&ray_1.d,local_4d4,&tMin,
                              &tMax);
          auVar28 = in_ZMM5._0_16_;
          auVar114 = in_ZMM1._8_56_;
          if (bVar10) {
            auVar115 = (undefined1  [56])0x0;
            local_4f8._0_4_ = *(Float *)&this_00[2].values.nStored;
            SVar204 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_00->values).nStored,lambda);
            auVar126._0_8_ = SVar204.values.values._8_8_;
            auVar126._8_56_ = auVar114;
            auVar46._0_8_ = SVar204.values.values._0_8_;
            auVar46._8_56_ = auVar115;
            auVar26 = vmovlhps_avx(auVar46._0_16_,auVar126._0_16_);
            bsdf._0_8_ = auVar26._0_8_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._0_4_ = auVar26._8_4_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._4_4_ = auVar26._12_4_;
            auVar115 = (undefined1  [56])0x0;
            SVar204 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_4f8._0_4_);
            auVar127._0_8_ = SVar204.values.values._8_8_;
            auVar127._8_56_ = auVar114;
            auVar47._0_8_ = SVar204.values.values._0_8_;
            auVar47._8_56_ = auVar115;
            sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar47._0_16_,auVar127._0_16_);
            local_4f8._0_4_ = *(undefined4 *)&this_00[2].values.nStored;
            auVar115 = (undefined1  [56])0x0;
            SVar204 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_00[1].values.nStored,lambda);
            auVar128._0_8_ = SVar204.values.values._8_8_;
            auVar128._8_56_ = auVar114;
            auVar48._0_8_ = SVar204.values.values._0_8_;
            auVar48._8_56_ = auVar115;
            auVar26 = vmovlhps_avx(auVar48._0_16_,auVar128._0_16_);
            bsdf._0_8_ = auVar26._0_8_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._0_4_ = auVar26._8_4_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._4_4_ = auVar26._12_4_;
            auVar115 = (undefined1  [56])0x0;
            SVar204 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_4f8._0_4_);
            auVar129._0_8_ = SVar204.values.values._8_8_;
            auVar129._8_56_ = auVar114;
            auVar49._0_8_ = SVar204.values.values._0_8_;
            auVar49._8_56_ = auVar115;
            sigma_s.values.values = (array<float,_4>)vmovlhps_avx(auVar49._0_16_,auVar129._0_16_);
            auVar115 = ZEXT856(sigma_s.values.values._8_8_);
            SVar204 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
            auVar130._0_8_ = SVar204.values.values._8_8_;
            auVar130._8_56_ = auVar114;
            auVar50._0_8_ = SVar204.values.values._0_8_;
            auVar50._8_56_ = auVar115;
            sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar50._0_16_,auVar130._0_16_);
            auVar114 = ZEXT856(sigma_t.values.values._8_8_);
            VVar201 = Bounds3<float>::Diagonal((Bounds3<float> *)&this_00->values);
            auVar131._4_60_ = auVar130._4_60_;
            auVar131._0_4_ = VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar51._0_8_ = VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar51._8_56_ = auVar114;
            auVar182._4_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.z;
            auVar182._0_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.y;
            auVar182._8_8_ = 0;
            auVar186._8_8_ = 0;
            auVar186._0_8_ = *(ulong *)((long)&(this_00->values).alloc.memoryResource + 4);
            auVar26 = vsubps_avx(auVar182,auVar186);
            auVar26 = vpermt2ps_avx512vl(auVar26,_DAT_00596440,
                                         ZEXT416((uint)(ray_1.o.super_Tuple3<pbrt::Point3,_float>.x
                                                       - *(float *)&(this_00->values).alloc.
                                                                    memoryResource)));
            auVar26 = vinsertps_avx(auVar26,ZEXT416((uint)ray_1.d.super_Tuple3<pbrt::Vector3,_float>
                                                          .x),0x30);
            auVar27 = vpermt2ps_avx512vl(auVar51._0_16_,_DAT_00596450,auVar131._0_16_);
            auVar187._4_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar187._0_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar187._8_8_ = 0;
            sigma_a_1.values.values = (array<float,_4>)vdivps_avx(auVar26,auVar27);
            auVar26 = vpermt2ps_avx512vl(auVar51._0_16_,ZEXT816(0x400000001),auVar131._0_16_);
            auVar26 = vdivps_avx(auVar187,auVar26);
            _local_498 = vmovlps_avx(auVar26);
            auVar114 = (undefined1  [56])0x0;
            local_490 = 0.0;
            local_488.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     )0;
            PVar202 = Ray::operator()((Ray *)&sigma_a_1,tMin);
            fVar116 = PVar202.super_Tuple3<pbrt::Point3,_float>.z;
            auVar52._0_8_ = PVar202.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar52._8_56_ = auVar114;
            auVar26 = vpcmpeqd_avx(auVar28,auVar28);
            ppfVar1 = &this_00[10].values.ptr;
            auVar189 = ZEXT816(0) << 0x40;
            lVar21 = 0;
            local_478._0_8_ = ppfVar1;
            iVar19 = *(int *)&this_00[10].values.ptr;
            auVar183._8_8_ = 0;
            auVar183._0_8_ = this_00[10].values.alloc.memoryResource;
            auVar28 = vcvtdq2ps_avx(auVar183);
            auVar26 = vpaddd_avx(auVar183,auVar26);
            auVar26 = vcvtdq2ps_avx(auVar26);
            fVar31 = auVar28._0_4_;
            fVar30 = PVar202.super_Tuple3<pbrt::Point3,_float>.x;
            auVar194._0_4_ = fVar30 * fVar31;
            auVar194._4_4_ = PVar202.super_Tuple3<pbrt::Point3,_float>.y * auVar28._4_4_;
            auVar194._8_4_ = auVar114._0_4_ * auVar28._8_4_;
            auVar194._12_4_ = auVar114._4_4_ * auVar28._12_4_;
            auVar28 = vmovshdup_avx(auVar28);
            fVar190 = 1.0 / fVar31;
            in_ZMM5 = ZEXT464((uint)fVar190);
            auVar27 = vmovshdup_avx(auVar26);
            uVar6 = vcmpps_avx512vl(auVar26,auVar194,1);
            auVar188 = vmovshdup_avx(auVar194);
            uVar113 = vcmpss_avx512f(auVar188,auVar189,1);
            bVar9 = (byte)(uVar6 >> 1);
            fVar179 = (float)iVar19;
            uVar7 = vcmpss_avx512f(auVar194,auVar189,1);
            iVar17 = (int)(float)((uint)!(bool)((byte)uVar113 & 1) *
                                 ((uint)(bVar9 & 1) * auVar27._0_4_ +
                                 (uint)!(bool)(bVar9 & 1) * auVar188._0_4_));
            iVar18 = (int)(float)((uint)!(bool)((byte)uVar7 & 1) *
                                 ((uint)((byte)uVar6 & 1) * auVar26._0_4_ +
                                 (uint)!(bool)((byte)uVar6 & 1) * (int)auVar194._0_4_));
            auVar195._0_4_ = (float)(iVar19 + -1);
            auVar195._4_12_ = in_ZMM12._4_12_;
            fVar191 = auVar28._0_4_;
            auVar28 = vminss_avx(auVar195,ZEXT416((uint)(fVar116 * fVar179)));
            uVar113 = vcmpss_avx512f(ZEXT416((uint)(fVar116 * fVar179)),auVar189,1);
            auVar26 = vmovshdup_avx(auVar52._0_16_);
            iVar19 = (int)(float)((uint)!(bool)((byte)uVar113 & 1) * auVar28._0_4_);
            local_4f8._0_4_ = tMin;
            for (; lVar21 != 3; lVar21 = lVar21 + 1) {
              pfVar13 = sigma_a_1.values.values + 3;
              iVar20 = (int)lVar21;
              if ((iVar20 != 0) && (pfVar13 = &local_498, iVar20 != 1)) {
                pfVar13 = &fStack_494;
              }
              if ((*pfVar13 == 0.0) && (!NAN(*pfVar13))) {
                pfVar13 = sigma_a_1.values.values + 3;
                if ((iVar20 != 0) && (pfVar13 = &local_498, iVar20 != 1)) {
                  pfVar13 = &fStack_494;
                }
                *pfVar13 = 0.0;
              }
              if (iVar20 == 1) {
                voxel[1] = iVar17;
                piVar22 = voxelLimit + 1;
                piVar23 = step + 1;
                pfVar15 = deltaT + 1;
                pfVar13 = nextCrossingT + 1;
                pfVar14 = &local_498;
                iVar16 = iVar17;
              }
              else if (iVar20 == 0) {
                voxel[lVar21] = iVar18;
                piVar22 = voxelLimit;
                piVar23 = step;
                pfVar15 = deltaT;
                pfVar13 = nextCrossingT;
                pfVar14 = sigma_a_1.values.values + 3;
                iVar16 = iVar18;
              }
              else {
                piVar22 = voxelLimit + 2;
                piVar23 = step + 2;
                pfVar15 = deltaT + 2;
                pfVar13 = nextCrossingT + 2;
                pfVar14 = &fStack_494;
                voxel[lVar21] = iVar19;
                iVar16 = iVar19;
              }
              if (0.0 <= *pfVar14) {
                pfVar14 = sigma_a_1.values.values + 3;
                pvVar24 = &this_00[10].values;
                fVar198 = fVar31;
                fVar199 = fVar30;
                fVar200 = fVar190;
                if ((iVar20 != 0) &&
                   (pfVar14 = &local_498,
                   pvVar24 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                             ((long)&this_00[10].values.alloc.memoryResource + 4), fVar198 = fVar191
                   , fVar199 = auVar26._0_4_, fVar200 = 1.0 / fVar191, iVar20 != 1)) {
                  pfVar14 = &fStack_494;
                  pvVar24 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar1;
                  fVar198 = fVar179;
                  fVar199 = fVar116;
                  fVar200 = 1.0 / fVar179;
                }
                *piVar23 = 1;
                auVar28 = vcvtsi2ss_avx512f(in_XMM16,iVar16 + 1);
                fVar2 = *pfVar14;
                *pfVar15 = fVar200 / fVar2;
                *pfVar13 = (auVar28._0_4_ / fVar198 - fVar199) / fVar2 + tMin;
                iVar20 = *(int *)&(pvVar24->alloc).memoryResource;
              }
              else {
                pfVar14 = sigma_a_1.values.values + 3;
                fVar198 = fVar31;
                fVar199 = fVar30;
                fVar200 = -fVar190;
                if ((iVar20 != 0) &&
                   (pfVar14 = &local_498, fVar198 = fVar191, fVar199 = auVar26._0_4_,
                   fVar200 = -(1.0 / fVar191), iVar20 != 1)) {
                  pfVar14 = &fStack_494;
                  fVar198 = fVar179;
                  fVar199 = fVar116;
                  fVar200 = -(1.0 / fVar179);
                }
                auVar28 = vcvtsi2ss_avx512f(in_XMM16,iVar16);
                *piVar23 = -1;
                fVar2 = *pfVar14;
                *pfVar15 = fVar200 / fVar2;
                *pfVar13 = (auVar28._0_4_ / fVar198 - fVar199) / fVar2 + tMin;
                iVar20 = -1;
              }
              in_ZMM12 = ZEXT464(0);
              *piVar22 = iVar20;
            }
            fVar31 = RNG::Uniform<float>(&rng);
            local_448._0_4_ = fVar31;
            local_428._0_8_ = uVar25 | 0x3000000000000;
            while( true ) {
              auVar115 = (undefined1  [56])0x0;
              iVar19 = *(int *)(&DAT_00596420 +
                               (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                      (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                      (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
              local_468 = (Transform *)CONCAT44(local_468._4_4_,nextCrossingT[iVar19]);
              auVar114 = (undefined1  [56])0x0;
              SVar204 = SampledSpectrum::operator*
                                  (&sigma_t,*(Float *)(this_00[9].values.nAlloc +
                                                      (((long)voxel[2] *
                                                        (long)*(int *)((long)&this_00[10].values.
                                                                              alloc.memoryResource +
                                                                      4) + (long)voxel[1]) *
                                                       (long)*(int *)&this_00[10].values.alloc.
                                                                      memoryResource +
                                                      (long)voxel[0]) * 4));
              auVar154._0_8_ = SVar204.values.values._8_8_;
              auVar154._8_56_ = auVar115;
              auVar81._0_8_ = SVar204.values.values._0_8_;
              auVar81._8_56_ = auVar114;
              auVar36 = ZEXT1664(auVar81._0_16_);
              sigma_maj.values.values =
                   (array<float,_4>)vmovlhps_avx(auVar81._0_16_,auVar154._0_16_);
              if (SVar204.values.values[0] <= 0.0) {
                in_ZMM1 = ZEXT464((uint)local_448._0_4_);
              }
              else {
                fVar31 = (float)local_4f8._0_4_;
                while( true ) {
                  local_4f8._0_4_ = fVar31;
                  FVar29 = InvertExponentialSample(local_468._0_4_ - fVar31,auVar36._0_4_);
                  if (FVar29 <= (float)local_448._0_4_) break;
                  in_ZMM1 = ZEXT464((uint)sigma_maj.values.values[0]);
                  FVar29 = SampleExponential((Float)local_448._0_4_,sigma_maj.values.values[0]);
                  auVar26 = in_ZMM12._0_16_;
                  auVar28 = in_ZMM5._0_16_;
                  auVar115 = in_ZMM1._8_56_;
                  fVar31 = FVar29 + (float)local_4f8._0_4_;
                  auVar114 = (undefined1  [56])0x0;
                  if (tMax <= fVar31) {
                    SampledSpectrum::SampledSpectrum((SampledSpectrum *)&intr,1.0);
                    auVar36 = ZEXT1664((undefined1  [16])
                                       intr.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_);
                    Li::anon_class_72_9_b858679e::operator()(&local_350,(MediumSample *)&bsdf);
                    goto LAB_00430e0a;
                  }
                  local_478._0_4_ = fVar31;
                  PVar202 = Ray::operator()(&ray_1,fVar31);
                  local_458.z = PVar202.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar82._0_8_ = PVar202.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  auVar82._8_56_ = auVar114;
                  local_458._0_8_ = vmovlps_avx(auVar82._0_16_);
                  SVar204 = SampledSpectrum::operator-(&sigma_maj);
                  auVar155._0_8_ = SVar204.values.values._8_8_;
                  auVar155._8_56_ = auVar115;
                  auVar83._0_8_ = SVar204.values.values._0_8_;
                  auVar83._8_56_ = auVar114;
                  intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                       vmovlhps_avx(auVar83._0_16_,auVar155._0_16_);
                  auVar114 = (undefined1  [56])0x0;
                  SVar204 = SampledSpectrum::operator*
                                      ((SampledSpectrum *)&intr,
                                       (float)local_478._0_4_ - (float)local_4f8._0_4_);
                  auVar156._0_8_ = SVar204.values.values._8_8_;
                  auVar156._8_56_ = auVar115;
                  auVar84._0_8_ = SVar204.values.values._0_8_;
                  auVar84._8_56_ = auVar114;
                  auVar27 = vmovlhps_avx(auVar84._0_16_,auVar156._0_16_);
                  auVar114 = ZEXT856(auVar27._8_8_);
                  bsdf._0_8_ = auVar27._0_8_;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._0_4_ = auVar27._8_4_;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._4_4_ = auVar27._12_4_;
                  SVar204 = FastExp((SampledSpectrum *)&bsdf);
                  auVar157._0_8_ = SVar204.values.values._8_8_;
                  auVar157._8_56_ = auVar115;
                  auVar85._0_8_ = SVar204.values.values._0_8_;
                  auVar85._8_56_ = auVar114;
                  local_4f8 = auVar85._0_16_;
                  local_448 = auVar157._0_16_;
                  SVar204 = CloudMediumProvider::Density
                                      (*(CloudMediumProvider **)this_00,(Point3f *)&local_458,lambda
                                      );
                  auVar158._0_8_ = SVar204.values.values._8_8_;
                  auVar158._8_56_ = auVar115;
                  auVar86._0_8_ = SVar204.values.values._0_8_;
                  auVar86._8_56_ = auVar114;
                  density.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar86._0_16_,auVar158._0_16_);
                  auVar114 = ZEXT856(density.values.values._8_8_);
                  SVar204 = CloudMediumProvider::Le
                                      (*(CloudMediumProvider **)this_00,(Point3f *)&local_458,lambda
                                      );
                  auVar159._0_8_ = SVar204.values.values._8_8_;
                  auVar159._8_56_ = auVar115;
                  auVar87._0_8_ = SVar204.values.values._0_8_;
                  auVar87._8_56_ = auVar114;
                  Le.values.values = (array<float,_4>)vmovlhps_avx(auVar87._0_16_,auVar159._0_16_);
                  auVar114 = ZEXT856(Le.values.values._8_8_);
                  PVar203 = Transform::operator()
                                      ((Transform *)&this_00[6].values,(Point3<float> *)&local_458);
                  uVar113 = auVar114._0_8_;
                  auVar177 = auVar159._4_12_;
                  local_380.z = PVar203.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar88._0_8_ = PVar203.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  auVar88._8_56_ = auVar114;
                  local_380._0_8_ = vmovlps_avx(auVar88._0_16_);
                  VVar201 = Normalize<float>((Vector3<float> *)local_480);
                  auVar34._0_8_ =
                       VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  auVar34._8_4_ = (uint)uVar113 ^ 0x80000000;
                  auVar34._12_4_ = (uint)((ulong)uVar113 >> 0x20) ^ 0x80000000;
                  local_390.z = -VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar118._0_8_ =
                       CONCAT44(auVar177._0_4_,VVar201.super_Tuple3<pbrt::Vector3,_float>.z) ^
                       0x8000000080000000;
                  auVar118._8_4_ = auVar177._4_4_ ^ 0x80000000;
                  auVar118._12_4_ = auVar177._8_4_ ^ 0x80000000;
                  auVar115 = ZEXT856(auVar118._8_8_);
                  local_390._0_8_ = vmovlps_avx(auVar34);
                  local_4e0 = (ray->super_Ray).time;
                  auVar114 = (undefined1  [56])0x0;
                  SVar204 = SampledSpectrum::operator*(&sigma_a,&density);
                  auVar160._0_8_ = SVar204.values.values._8_8_;
                  auVar160._8_56_ = auVar115;
                  auVar89._0_8_ = SVar204.values.values._0_8_;
                  auVar89._8_56_ = auVar114;
                  auVar27 = vmovlhps_avx(auVar89._0_16_,auVar160._0_16_);
                  auVar114 = ZEXT856(auVar27._8_8_);
                  bsdf._0_8_ = auVar27._0_8_;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._0_4_ = auVar27._8_4_;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._4_4_ = auVar27._12_4_;
                  SVar204 = SampledSpectrum::operator*(&sigma_s,&density);
                  auVar161._0_8_ = SVar204.values.values._8_8_;
                  auVar161._8_56_ = auVar115;
                  auVar90._0_8_ = SVar204.values.values._0_8_;
                  auVar90._8_56_ = auVar114;
                  local_1f8.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar90._0_16_,auVar161._0_16_);
                  local_3a0.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       ((ulong)((long)&this_00[2].values.nStored + 4U) | 0x1000000000000);
                  local_398.bits = uVar25 | 0x3000000000000;
                  MediumInteraction::MediumInteraction
                            (&intr,(Point3f *)&local_380,(Vector3f *)&local_390,local_4e0,
                             (SampledSpectrum *)&bsdf,&local_1f8,&sigma_maj,&Le,
                             (MediumHandle *)&local_398,&local_3a0);
                  auVar188 = (undefined1  [16])
                             intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_;
                  bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x =
                       intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
                  bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z =
                       intr.super_Interaction.time;
                  bsdf.eta = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                  bsdf._4_4_ = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._0_4_ = auVar188._8_4_;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._4_4_ = auVar188._12_4_;
                  bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x =
                       intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                  bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y =
                       intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                  bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
                       intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                  bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z =
                       intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                  bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x =
                       intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y =
                       intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z =
                       intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
                  bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x =
                       intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
                  bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y =
                       intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
                  bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z =
                       (float)intr.super_Interaction._60_4_;
                  auVar27 = vunpcklpd_avx(local_4f8,local_448);
                  auVar36 = ZEXT1664(auVar27);
                  in_ZMM1 = ZEXT1664((undefined1  [16])intr._72_16_);
                  in_ZMM5 = ZEXT1664(auVar28);
                  in_ZMM12 = ZEXT1664(auVar26);
                  intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = auVar188;
                  bVar10 = Li::anon_class_72_9_b858679e::operator()
                                     (&local_350,(MediumSample *)&bsdf);
                  pstd::optional<pbrt::MediumInteraction>::~optional
                            ((optional<pbrt::MediumInteraction> *)&bsdf);
                  if (!bVar10) goto LAB_00430e92;
                  fVar31 = RNG::Uniform<float>(&rng);
                  local_448._0_4_ = fVar31;
                  auVar36 = ZEXT464((uint)sigma_maj.values.values[0]);
                  fVar31 = (float)local_478._0_4_;
                }
                auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                     ZEXT416((uint)(((float)local_448._0_4_ - FVar29) /
                                                   (1.0 - FVar29))));
                in_ZMM1 = ZEXT1664(auVar28);
              }
              auVar36 = ZEXT464((uint)local_468._0_4_);
              if ((tMax < local_468._0_4_) ||
                 (iVar17 = voxel[iVar19], voxel[iVar19] = iVar17 + step[iVar19],
                 iVar17 + step[iVar19] == voxelLimit[iVar19])) break;
              local_448._0_4_ = in_ZMM1._0_4_;
              local_4f8._0_4_ = local_468._0_4_;
              nextCrossingT[iVar19] = local_468._0_4_ + deltaT[iVar19];
            }
          }
        }
        else {
          local_350.L = &L;
          local_350.sampler = (SamplerHandle *)local_460;
          local_350.terminated = &terminated;
          local_350.numScatters = &numScatters;
          local_350.beta = &beta;
          local_350.scattered = &scattered;
          fVar31 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar28 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar31)),auVar28,auVar28);
          auVar178 = ZEXT1260(auVar28._4_12_);
          auVar26 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar28 = vfmadd213ss_fma(auVar26,auVar26,auVar28);
          auVar28 = vsqrtss_avx(auVar28,auVar28);
          local_4d4 = auVar28._0_4_ * (float)local_4f8._0_4_;
          auVar114 = (undefined1  [56])0x0;
          VVar201 = Normalize<float>((Vector3<float> *)local_480);
          in_ZMM1._0_4_ = VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
          in_ZMM1._4_60_ = auVar178;
          auVar63._0_8_ = VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar63._8_56_ = auVar114;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          bsdf.eta = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          bsdf._4_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          uVar113 = vmovlps_avx(auVar63._0_16_);
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._4_4_ = (float)uVar113;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar113 >> 0x20)
          ;
          bsdf.shadingFrame._8_8_ = bsdf.shadingFrame._8_8_ & 0xffffffff00000000;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = in_ZMM1._0_4_;
          Transform::operator()(&ray_1,(Transform *)(this_00 + 3),(Ray *)&bsdf,&local_4d4);
          auVar36 = ZEXT464((uint)local_4d4);
          bVar10 = Bounds3<float>::IntersectP
                             ((Bounds3<float> *)&this_00->values,&ray_1.o,&ray_1.d,local_4d4,&tMin,
                              &tMax);
          auVar28 = in_ZMM5._0_16_;
          auVar114 = in_ZMM1._8_56_;
          if (bVar10) {
            auVar115 = (undefined1  [56])0x0;
            local_4f8._0_4_ = *(Float *)&this_00[2].values.nStored;
            SVar204 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_00->values).nStored,lambda);
            auVar140._0_8_ = SVar204.values.values._8_8_;
            auVar140._8_56_ = auVar114;
            auVar64._0_8_ = SVar204.values.values._0_8_;
            auVar64._8_56_ = auVar115;
            auVar26 = vmovlhps_avx(auVar64._0_16_,auVar140._0_16_);
            bsdf._0_8_ = auVar26._0_8_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._0_4_ = auVar26._8_4_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._4_4_ = auVar26._12_4_;
            auVar115 = (undefined1  [56])0x0;
            SVar204 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_4f8._0_4_);
            auVar141._0_8_ = SVar204.values.values._8_8_;
            auVar141._8_56_ = auVar114;
            auVar65._0_8_ = SVar204.values.values._0_8_;
            auVar65._8_56_ = auVar115;
            sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar65._0_16_,auVar141._0_16_);
            local_4f8._0_4_ = *(undefined4 *)&this_00[2].values.nStored;
            auVar115 = (undefined1  [56])0x0;
            SVar204 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_00[1].values.nStored,lambda);
            auVar142._0_8_ = SVar204.values.values._8_8_;
            auVar142._8_56_ = auVar114;
            auVar66._0_8_ = SVar204.values.values._0_8_;
            auVar66._8_56_ = auVar115;
            auVar26 = vmovlhps_avx(auVar66._0_16_,auVar142._0_16_);
            bsdf._0_8_ = auVar26._0_8_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._0_4_ = auVar26._8_4_;
            bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
            .bits._4_4_ = auVar26._12_4_;
            auVar115 = (undefined1  [56])0x0;
            SVar204 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_4f8._0_4_);
            auVar143._0_8_ = SVar204.values.values._8_8_;
            auVar143._8_56_ = auVar114;
            auVar67._0_8_ = SVar204.values.values._0_8_;
            auVar67._8_56_ = auVar115;
            sigma_s.values.values = (array<float,_4>)vmovlhps_avx(auVar67._0_16_,auVar143._0_16_);
            auVar115 = ZEXT856(sigma_s.values.values._8_8_);
            SVar204 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
            auVar144._0_8_ = SVar204.values.values._8_8_;
            auVar144._8_56_ = auVar114;
            auVar68._0_8_ = SVar204.values.values._0_8_;
            auVar68._8_56_ = auVar115;
            sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar68._0_16_,auVar144._0_16_);
            auVar114 = ZEXT856(sigma_t.values.values._8_8_);
            VVar201 = Bounds3<float>::Diagonal((Bounds3<float> *)&this_00->values);
            auVar145._4_60_ = auVar144._4_60_;
            auVar145._0_4_ = VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar69._0_8_ = VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar69._8_56_ = auVar114;
            auVar26._4_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.z;
            auVar26._0_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.y;
            auVar26._8_8_ = 0;
            auVar188._8_8_ = 0;
            auVar188._0_8_ = *(ulong *)((long)&(this_00->values).alloc.memoryResource + 4);
            auVar26 = vsubps_avx(auVar26,auVar188);
            auVar26 = vpermt2ps_avx512vl(auVar26,_DAT_00596440,
                                         ZEXT416((uint)(ray_1.o.super_Tuple3<pbrt::Point3,_float>.x
                                                       - *(float *)&(this_00->values).alloc.
                                                                    memoryResource)));
            auVar26 = vinsertps_avx(auVar26,ZEXT416((uint)ray_1.d.super_Tuple3<pbrt::Vector3,_float>
                                                          .x),0x30);
            auVar27 = vpermt2ps_avx512vl(auVar69._0_16_,_DAT_00596450,auVar145._0_16_);
            auVar189._4_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar189._0_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar189._8_8_ = 0;
            sigma_a_1.values.values = (array<float,_4>)vdivps_avx(auVar26,auVar27);
            auVar26 = vpermt2ps_avx512vl(auVar69._0_16_,ZEXT816(0x400000001),auVar145._0_16_);
            auVar26 = vdivps_avx(auVar189,auVar26);
            _local_498 = vmovlps_avx(auVar26);
            auVar114 = (undefined1  [56])0x0;
            local_490 = 0.0;
            local_488.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     )0;
            PVar202 = Ray::operator()((Ray *)&sigma_a_1,tMin);
            fVar116 = PVar202.super_Tuple3<pbrt::Point3,_float>.z;
            auVar70._0_8_ = PVar202.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar70._8_56_ = auVar114;
            auVar26 = vpcmpeqd_avx(auVar28,auVar28);
            ppfVar1 = &this_00[10].values.ptr;
            auVar189 = ZEXT816(0) << 0x40;
            lVar21 = 0;
            local_478._0_8_ = ppfVar1;
            iVar19 = *(int *)&this_00[10].values.ptr;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = this_00[10].values.alloc.memoryResource;
            auVar28 = vcvtdq2ps_avx(auVar27);
            auVar26 = vpaddd_avx(auVar27,auVar26);
            auVar26 = vcvtdq2ps_avx(auVar26);
            fVar31 = auVar28._0_4_;
            fVar30 = PVar202.super_Tuple3<pbrt::Point3,_float>.x;
            auVar196._0_4_ = fVar30 * fVar31;
            auVar196._4_4_ = PVar202.super_Tuple3<pbrt::Point3,_float>.y * auVar28._4_4_;
            auVar196._8_4_ = auVar114._0_4_ * auVar28._8_4_;
            auVar196._12_4_ = auVar114._4_4_ * auVar28._12_4_;
            auVar28 = vmovshdup_avx(auVar28);
            fVar190 = 1.0 / fVar31;
            in_ZMM5 = ZEXT464((uint)fVar190);
            auVar27 = vmovshdup_avx(auVar26);
            uVar25 = vcmpps_avx512vl(auVar26,auVar196,1);
            auVar188 = vmovshdup_avx(auVar196);
            uVar113 = vcmpss_avx512f(auVar188,auVar189,1);
            bVar9 = (byte)(uVar25 >> 1);
            fVar179 = (float)iVar19;
            uVar7 = vcmpss_avx512f(auVar196,auVar189,1);
            iVar17 = (int)(float)((uint)!(bool)((byte)uVar113 & 1) *
                                 ((uint)(bVar9 & 1) * auVar27._0_4_ +
                                 (uint)!(bool)(bVar9 & 1) * auVar188._0_4_));
            iVar18 = (int)(float)((uint)!(bool)((byte)uVar7 & 1) *
                                 ((uint)((byte)uVar25 & 1) * auVar26._0_4_ +
                                 (uint)!(bool)((byte)uVar25 & 1) * (int)auVar196._0_4_));
            auVar197._0_4_ = (float)(iVar19 + -1);
            auVar197._4_12_ = in_ZMM12._4_12_;
            fVar191 = auVar28._0_4_;
            auVar28 = vminss_avx(auVar197,ZEXT416((uint)(fVar116 * fVar179)));
            uVar113 = vcmpss_avx512f(ZEXT416((uint)(fVar116 * fVar179)),auVar189,1);
            auVar26 = vmovshdup_avx(auVar70._0_16_);
            iVar19 = (int)(float)((uint)!(bool)((byte)uVar113 & 1) * auVar28._0_4_);
            local_4f8._0_4_ = tMin;
            for (; lVar21 != 3; lVar21 = lVar21 + 1) {
              pfVar13 = sigma_a_1.values.values + 3;
              iVar20 = (int)lVar21;
              if ((iVar20 != 0) && (pfVar13 = &local_498, iVar20 != 1)) {
                pfVar13 = &fStack_494;
              }
              if ((*pfVar13 == 0.0) && (!NAN(*pfVar13))) {
                pfVar13 = sigma_a_1.values.values + 3;
                if ((iVar20 != 0) && (pfVar13 = &local_498, iVar20 != 1)) {
                  pfVar13 = &fStack_494;
                }
                *pfVar13 = 0.0;
              }
              if (iVar20 == 1) {
                voxel[1] = iVar17;
                piVar22 = voxelLimit + 1;
                piVar23 = step + 1;
                pfVar15 = deltaT + 1;
                pfVar13 = nextCrossingT + 1;
                pfVar14 = &local_498;
                iVar16 = iVar17;
              }
              else if (iVar20 == 0) {
                voxel[lVar21] = iVar18;
                piVar22 = voxelLimit;
                piVar23 = step;
                pfVar15 = deltaT;
                pfVar13 = nextCrossingT;
                pfVar14 = sigma_a_1.values.values + 3;
                iVar16 = iVar18;
              }
              else {
                piVar22 = voxelLimit + 2;
                piVar23 = step + 2;
                pfVar15 = deltaT + 2;
                pfVar13 = nextCrossingT + 2;
                pfVar14 = &fStack_494;
                voxel[lVar21] = iVar19;
                iVar16 = iVar19;
              }
              if (0.0 <= *pfVar14) {
                pfVar14 = sigma_a_1.values.values + 3;
                pvVar24 = &this_00[10].values;
                fVar198 = fVar31;
                fVar199 = fVar30;
                fVar200 = fVar190;
                if ((iVar20 != 0) &&
                   (pfVar14 = &local_498,
                   pvVar24 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                             ((long)&this_00[10].values.alloc.memoryResource + 4), fVar198 = fVar191
                   , fVar199 = auVar26._0_4_, fVar200 = 1.0 / fVar191, iVar20 != 1)) {
                  pfVar14 = &fStack_494;
                  pvVar24 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar1;
                  fVar198 = fVar179;
                  fVar199 = fVar116;
                  fVar200 = 1.0 / fVar179;
                }
                *piVar23 = 1;
                auVar28 = vcvtsi2ss_avx512f(in_XMM16,iVar16 + 1);
                fVar2 = *pfVar14;
                *pfVar15 = fVar200 / fVar2;
                *pfVar13 = (auVar28._0_4_ / fVar198 - fVar199) / fVar2 + tMin;
                iVar20 = *(int *)&(pvVar24->alloc).memoryResource;
              }
              else {
                pfVar14 = sigma_a_1.values.values + 3;
                fVar198 = fVar31;
                fVar199 = fVar30;
                fVar200 = -fVar190;
                if ((iVar20 != 0) &&
                   (pfVar14 = &local_498, fVar198 = fVar191, fVar199 = auVar26._0_4_,
                   fVar200 = -(1.0 / fVar191), iVar20 != 1)) {
                  pfVar14 = &fStack_494;
                  fVar198 = fVar179;
                  fVar199 = fVar116;
                  fVar200 = -(1.0 / fVar179);
                }
                auVar28 = vcvtsi2ss_avx512f(in_XMM16,iVar16);
                *piVar23 = -1;
                fVar2 = *pfVar14;
                *pfVar15 = fVar200 / fVar2;
                *pfVar13 = (auVar28._0_4_ / fVar198 - fVar199) / fVar2 + tMin;
                iVar20 = -1;
              }
              in_ZMM12 = ZEXT464(0);
              *piVar22 = iVar20;
            }
            fVar31 = RNG::Uniform<float>(&rng);
            local_428._0_4_ = fVar31;
            local_468 = (Transform *)&this_00[6].values;
            while( true ) {
              auVar115 = (undefined1  [56])0x0;
              iVar19 = *(int *)(&DAT_00596420 +
                               (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                      (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                      (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
              local_4e0 = nextCrossingT[iVar19];
              auVar114 = (undefined1  [56])0x0;
              SVar204 = SampledSpectrum::operator*
                                  (&sigma_t,*(Float *)(this_00[9].values.nAlloc +
                                                      (((long)voxel[2] *
                                                        (long)*(int *)((long)&this_00[10].values.
                                                                              alloc.memoryResource +
                                                                      4) + (long)voxel[1]) *
                                                       (long)*(int *)&this_00[10].values.alloc.
                                                                      memoryResource +
                                                      (long)voxel[0]) * 4));
              auVar162._0_8_ = SVar204.values.values._8_8_;
              auVar162._8_56_ = auVar115;
              auVar91._0_8_ = SVar204.values.values._0_8_;
              auVar91._8_56_ = auVar114;
              auVar36 = ZEXT1664(auVar91._0_16_);
              sigma_maj.values.values =
                   (array<float,_4>)vmovlhps_avx(auVar91._0_16_,auVar162._0_16_);
              if (SVar204.values.values[0] <= 0.0) {
                in_ZMM1 = ZEXT464((uint)local_428._0_4_);
              }
              else {
                fVar31 = (float)local_4f8._0_4_;
                while( true ) {
                  local_4f8._0_4_ = fVar31;
                  FVar29 = InvertExponentialSample(local_4e0 - fVar31,auVar36._0_4_);
                  if (FVar29 <= (float)local_428._0_4_) break;
                  in_ZMM1 = ZEXT464((uint)sigma_maj.values.values[0]);
                  FVar29 = SampleExponential((Float)local_428._0_4_,sigma_maj.values.values[0]);
                  auVar26 = in_ZMM12._0_16_;
                  auVar28 = in_ZMM5._0_16_;
                  auVar115 = in_ZMM1._8_56_;
                  fVar31 = FVar29 + (float)local_4f8._0_4_;
                  auVar114 = (undefined1  [56])0x0;
                  if (tMax <= fVar31) {
                    SampledSpectrum::SampledSpectrum((SampledSpectrum *)&intr,1.0);
                    auVar36 = ZEXT1664((undefined1  [16])
                                       intr.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_);
                    Li::anon_class_72_9_b858679e::operator()(&local_350,(MediumSample *)&bsdf);
                    goto LAB_00430e0a;
                  }
                  local_478._0_4_ = fVar31;
                  PVar202 = Ray::operator()(&ray_1,fVar31);
                  local_458.z = PVar202.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar92._0_8_ = PVar202.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  auVar92._8_56_ = auVar114;
                  local_458._0_8_ = vmovlps_avx(auVar92._0_16_);
                  SVar204 = SampledSpectrum::operator-(&sigma_maj);
                  auVar163._0_8_ = SVar204.values.values._8_8_;
                  auVar163._8_56_ = auVar115;
                  auVar93._0_8_ = SVar204.values.values._0_8_;
                  auVar93._8_56_ = auVar114;
                  intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                       vmovlhps_avx(auVar93._0_16_,auVar163._0_16_);
                  auVar114 = (undefined1  [56])0x0;
                  SVar204 = SampledSpectrum::operator*
                                      ((SampledSpectrum *)&intr,
                                       (float)local_478._0_4_ - (float)local_4f8._0_4_);
                  auVar164._0_8_ = SVar204.values.values._8_8_;
                  auVar164._8_56_ = auVar115;
                  auVar94._0_8_ = SVar204.values.values._0_8_;
                  auVar94._8_56_ = auVar114;
                  auVar27 = vmovlhps_avx(auVar94._0_16_,auVar164._0_16_);
                  auVar114 = ZEXT856(auVar27._8_8_);
                  bsdf._0_8_ = auVar27._0_8_;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._0_4_ = auVar27._8_4_;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._4_4_ = auVar27._12_4_;
                  SVar204 = FastExp((SampledSpectrum *)&bsdf);
                  auVar165._0_8_ = SVar204.values.values._8_8_;
                  auVar165._8_56_ = auVar115;
                  auVar95._0_8_ = SVar204.values.values._0_8_;
                  auVar95._8_56_ = auVar114;
                  local_4f8 = auVar95._0_16_;
                  local_428._0_16_ = auVar165._0_16_;
                  SVar204 = NanoVDBMediumProvider::Density
                                      (*(NanoVDBMediumProvider **)this_00,(Point3f *)&local_458,
                                       lambda);
                  auVar166._0_8_ = SVar204.values.values._8_8_;
                  auVar166._8_56_ = auVar115;
                  auVar96._0_8_ = SVar204.values.values._0_8_;
                  auVar96._8_56_ = auVar114;
                  density.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar96._0_16_,auVar166._0_16_);
                  auVar114 = ZEXT856(density.values.values._8_8_);
                  SVar204 = NanoVDBMediumProvider::Le
                                      (*(NanoVDBMediumProvider **)this_00,(Point3f *)&local_458,
                                       lambda);
                  auVar167._0_8_ = SVar204.values.values._8_8_;
                  auVar167._8_56_ = auVar115;
                  auVar97._0_8_ = SVar204.values.values._0_8_;
                  auVar97._8_56_ = auVar114;
                  Le.values.values = (array<float,_4>)vmovlhps_avx(auVar97._0_16_,auVar167._0_16_);
                  auVar114 = ZEXT856(Le.values.values._8_8_);
                  PVar203 = Transform::operator()(local_468,(Point3<float> *)&local_458);
                  uVar113 = auVar114._0_8_;
                  auVar177 = auVar167._4_12_;
                  local_380.z = PVar203.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar98._0_8_ = PVar203.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  auVar98._8_56_ = auVar114;
                  local_380._0_8_ = vmovlps_avx(auVar98._0_16_);
                  VVar201 = Normalize<float>((Vector3<float> *)local_480);
                  auVar35._0_8_ =
                       VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  auVar35._8_4_ = (uint)uVar113 ^ 0x80000000;
                  auVar35._12_4_ = (uint)((ulong)uVar113 >> 0x20) ^ 0x80000000;
                  local_390.z = -VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar119._0_8_ =
                       CONCAT44(auVar177._0_4_,VVar201.super_Tuple3<pbrt::Vector3,_float>.z) ^
                       0x8000000080000000;
                  auVar119._8_4_ = auVar177._4_4_ ^ 0x80000000;
                  auVar119._12_4_ = auVar177._8_4_ ^ 0x80000000;
                  auVar115 = ZEXT856(auVar119._8_8_);
                  local_390._0_8_ = vmovlps_avx(auVar35);
                  auVar114 = (undefined1  [56])0x0;
                  local_448._0_4_ = (ray->super_Ray).time;
                  SVar204 = SampledSpectrum::operator*(&sigma_a,&density);
                  auVar168._0_8_ = SVar204.values.values._8_8_;
                  auVar168._8_56_ = auVar115;
                  auVar99._0_8_ = SVar204.values.values._0_8_;
                  auVar99._8_56_ = auVar114;
                  auVar27 = vmovlhps_avx(auVar99._0_16_,auVar168._0_16_);
                  auVar114 = ZEXT856(auVar27._8_8_);
                  bsdf._0_8_ = auVar27._0_8_;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._0_4_ = auVar27._8_4_;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._4_4_ = auVar27._12_4_;
                  SVar204 = SampledSpectrum::operator*(&sigma_s,&density);
                  auVar169._0_8_ = SVar204.values.values._8_8_;
                  auVar169._8_56_ = auVar115;
                  auVar100._0_8_ = SVar204.values.values._0_8_;
                  auVar100._8_56_ = auVar114;
                  local_1f8.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar100._0_16_,auVar169._0_16_);
                  local_3a0.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       ((ulong)((long)&this_00[2].values.nStored + 4U) | 0x1000000000000);
                  local_398.bits = (ulong)this_00 | 0x4000000000000;
                  MediumInteraction::MediumInteraction
                            (&intr,(Point3f *)&local_380,(Vector3f *)&local_390,
                             (Float)local_448._0_4_,(SampledSpectrum *)&bsdf,&local_1f8,&sigma_maj,
                             &Le,(MediumHandle *)&local_398,&local_3a0);
                  auVar188 = (undefined1  [16])
                             intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_;
                  bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x =
                       intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
                  bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z =
                       intr.super_Interaction.time;
                  bsdf.eta = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                  bsdf._4_4_ = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._0_4_ = auVar188._8_4_;
                  bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits._4_4_ = auVar188._12_4_;
                  bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x =
                       intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                  bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y =
                       intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                  bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
                       intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                  bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z =
                       intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                  bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x =
                       intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y =
                       intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z =
                       intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
                  bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x =
                       intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
                  bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y =
                       intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
                  bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z =
                       (float)intr.super_Interaction._60_4_;
                  auVar27 = vunpcklpd_avx(local_4f8,local_428._0_16_);
                  auVar36 = ZEXT1664(auVar27);
                  in_ZMM1 = ZEXT1664((undefined1  [16])intr._72_16_);
                  in_ZMM5 = ZEXT1664(auVar28);
                  in_ZMM12 = ZEXT1664(auVar26);
                  intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = auVar188;
                  bVar10 = Li::anon_class_72_9_b858679e::operator()
                                     (&local_350,(MediumSample *)&bsdf);
                  pstd::optional<pbrt::MediumInteraction>::~optional
                            ((optional<pbrt::MediumInteraction> *)&bsdf);
                  if (!bVar10) goto LAB_00430e92;
                  local_428._0_4_ = RNG::Uniform<float>(&rng);
                  local_428._4_12_ = auVar165._4_12_;
                  auVar36 = ZEXT464((uint)sigma_maj.values.values[0]);
                  fVar31 = (float)local_478._0_4_;
                }
                auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                     ZEXT416((uint)(((float)local_428._0_4_ - FVar29) /
                                                   (1.0 - FVar29))));
                in_ZMM1 = ZEXT1664(auVar28);
              }
              auVar36 = ZEXT464((uint)local_4e0);
              if ((tMax < local_4e0) ||
                 (iVar17 = voxel[iVar19], voxel[iVar19] = iVar17 + step[iVar19],
                 iVar17 + step[iVar19] == voxelLimit[iVar19])) break;
              local_428._0_4_ = in_ZMM1._0_4_;
              local_4f8._0_4_ = local_4e0;
              nextCrossingT[iVar19] = local_4e0 + deltaT[iVar19];
            }
          }
        }
      }
LAB_00430e92:
      sampler = (SamplerHandle *)local_460;
      if ((terminated & 1U) != 0) goto LAB_0043113e;
    }
    auVar115 = in_ZMM1._8_56_;
    auVar114 = auVar36._8_56_;
    if (scattered == false) {
      if (si.set == false) {
        this_01 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   *)(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                     infiniteLights.
                     super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        pTVar4 = *(TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   **)((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator
                              .infiniteLights.
                              super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                              ._M_impl.super__Vector_impl_data + 8);
        while( true ) {
          auVar115 = in_ZMM1._8_56_;
          auVar114 = auVar36._8_56_;
          if (this_01 == pTVar4) break;
          func.lambda = lambda;
          func.ray = &ray->super_Ray;
          SVar204 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                    ::
                    Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                              (this_01,func);
          auVar174._0_8_ = SVar204.values.values._8_8_;
          auVar174._8_56_ = auVar115;
          auVar108._0_8_ = SVar204.values.values._0_8_;
          auVar108._8_56_ = auVar114;
          local_350._0_16_ = vmovlhps_avx(auVar108._0_16_,auVar174._0_16_);
          auVar114 = ZEXT856(local_350.L);
          SVar204 = SampledSpectrum::operator*(&beta,(SampledSpectrum *)&local_350);
          auVar175._0_8_ = SVar204.values.values._8_8_;
          auVar175._8_56_ = auVar115;
          auVar109._0_8_ = SVar204.values.values._0_8_;
          auVar109._8_56_ = auVar114;
          intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
               vmovlhps_avx(auVar109._0_16_,auVar175._0_16_);
          auVar114 = ZEXT856(intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
          SVar204 = SampledWavelengths::PDF(lambda);
          auVar176._0_8_ = SVar204.values.values._8_8_;
          auVar176._8_56_ = auVar115;
          auVar110._0_8_ = SVar204.values.values._0_8_;
          auVar110._8_56_ = auVar114;
          auVar28 = vmovlhps_avx(auVar110._0_16_,auVar176._0_16_);
          auVar114 = ZEXT856(auVar28._8_8_);
          ray_1.o.super_Tuple3<pbrt::Point3,_float>.x = auVar28._0_4_;
          ray_1.o.super_Tuple3<pbrt::Point3,_float>.y = auVar28._4_4_;
          ray_1.o.super_Tuple3<pbrt::Point3,_float>.z = auVar28._8_4_;
          ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar28._12_4_;
          SVar204 = SafeDiv((SampledSpectrum *)&intr,(SampledSpectrum *)&ray_1);
          in_ZMM1._0_8_ = SVar204.values.values._8_8_;
          in_ZMM1._8_56_ = auVar115;
          auVar111._0_8_ = SVar204.values.values._0_8_;
          auVar111._8_56_ = auVar114;
          auVar28 = vmovlhps_avx(auVar111._0_16_,in_ZMM1._0_16_);
          auVar36 = ZEXT1664(auVar28);
          bsdf._0_8_ = auVar28._0_8_;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._0_4_ = auVar28._8_4_;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._4_4_ = auVar28._12_4_;
          SampledSpectrum::operator+=(&L,(SampledSpectrum *)&bsdf);
          this_01 = this_01 + 8;
        }
LAB_0043113e:
        pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
        return (SampledSpectrum)L.values;
      }
      pSVar11 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      VVar201 = Tuple3<pbrt::Vector3,_float>::operator-(local_480);
      auVar103._0_8_ = VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar103._8_56_ = auVar114;
      uVar113 = vmovlps_avx(auVar103._0_16_);
      sigma_a_1.values.values[2] = VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
      sigma_a_1.values.values[0] = (float)(int)uVar113;
      sigma_a_1.values.values[1] = (float)(int)((ulong)uVar113 >> 0x20);
      SVar204 = SurfaceInteraction::Le(&pSVar11->intr,(Vector3f *)&sigma_a_1,lambda);
      auVar171._0_8_ = SVar204.values.values._8_8_;
      auVar171._8_56_ = auVar115;
      auVar104._0_8_ = SVar204.values.values._0_8_;
      auVar104._8_56_ = auVar114;
      local_350._0_16_ = vmovlhps_avx(auVar104._0_16_,auVar171._0_16_);
      auVar114 = ZEXT856(local_350.L);
      SVar204 = SampledSpectrum::operator*(&beta,(SampledSpectrum *)&local_350);
      auVar172._0_8_ = SVar204.values.values._8_8_;
      auVar172._8_56_ = auVar115;
      auVar105._0_8_ = SVar204.values.values._0_8_;
      auVar105._8_56_ = auVar114;
      intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
           vmovlhps_avx(auVar105._0_16_,auVar172._0_16_);
      auVar114 = ZEXT856(intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
      SVar204 = SampledWavelengths::PDF(lambda);
      auVar173._0_8_ = SVar204.values.values._8_8_;
      auVar173._8_56_ = auVar115;
      auVar106._0_8_ = SVar204.values.values._0_8_;
      auVar106._8_56_ = auVar114;
      auVar28 = vmovlhps_avx(auVar106._0_16_,auVar173._0_16_);
      auVar114 = ZEXT856(auVar28._8_8_);
      ray_1.o.super_Tuple3<pbrt::Point3,_float>.x = auVar28._0_4_;
      ray_1.o.super_Tuple3<pbrt::Point3,_float>.y = auVar28._4_4_;
      ray_1.o.super_Tuple3<pbrt::Point3,_float>.z = auVar28._8_4_;
      ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar28._12_4_;
      SVar204 = SafeDiv((SampledSpectrum *)&intr,(SampledSpectrum *)&ray_1);
      in_ZMM1._0_8_ = SVar204.values.values._8_8_;
      in_ZMM1._8_56_ = auVar115;
      auVar107._0_8_ = SVar204.values.values._0_8_;
      auVar107._8_56_ = auVar114;
      auVar28 = vmovlhps_avx(auVar107._0_16_,in_ZMM1._0_16_);
      bsdf._0_8_ = auVar28._0_8_;
      bsdf.bxdf.
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
      .bits._0_4_ = auVar28._8_4_;
      bsdf.bxdf.
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
      .bits._4_4_ = auVar28._12_4_;
      SampledSpectrum::operator+=(&L,(SampledSpectrum *)&bsdf);
      local_140.bits =
           (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_148 = *sampler;
      SurfaceInteraction::GetBSDF
                (&bsdf,&pSVar11->intr,ray,lambda,(CameraHandle *)&local_140,scratchBuffer,
                 (SamplerHandle)&local_148);
      if ((CONCAT44(bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits._4_4_,
                    (float)bsdf.bxdf.
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                           .bits) & 0xffffffffffff) != 0) {
        VVar201 = Tuple3<pbrt::Vector3,_float>::operator-(local_480);
        woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
             VVar201.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_4f8._0_4_ = VVar201.super_Tuple3<pbrt::Vector3,_float>.z;
        FVar29 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                 ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                             *)sampler);
        local_480 = (Tuple3<pbrt::Vector3,_float> *)CONCAT44(local_480._4_4_,FVar29);
        auVar112._0_8_ =
             TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
             ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                         *)sampler);
        auVar112._8_56_ = extraout_var_00;
        uVar113 = vmovlps_avx(auVar112._0_16_);
        local_350.sampler = (SamplerHandle *)uVar113;
        woRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_4f8._0_4_;
        BSDF::Sample_f((BSDFSample *)&intr,&bsdf,woRender,local_480._0_4_,(Point2f *)&local_350,
                       Radiance,All);
        if (0.0 < intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x) {
          ErrorExit<>("SimpleVolPathIntegrator doesn\'t support scattering from surfaces");
        }
        goto LAB_0043113e;
      }
      pSVar12 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      SurfaceInteraction::SkipIntersection(&pSVar11->intr,ray,pSVar12->tHit);
    }
    pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  } while( true );
LAB_0043034c:
  fVar31 = RNG::Uniform<float>(&rng);
  local_448._0_4_ = fVar31;
  auVar36 = ZEXT464((uint)sigma_maj.values.values[0]);
  fVar31 = (float)local_478._0_4_;
  goto LAB_00430074;
}

Assistant:

SampledSpectrum SimpleVolPathIntegrator::Li(RayDifferential ray,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler,
                                            ScratchBuffer &scratchBuffer,
                                            VisibleSurface *) const {
    SampledSpectrum L(0.f), beta(1.f);
    int numScatters = 0;
    lambda.TerminateSecondary();
    while (true) {
        // Estimate radiance for ray path using delta tracking
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        bool scattered = false, terminated = false;
        if (ray.medium) {
            // Sample medium scattering for _SimpleVolPathIntegrator_
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(sampler.Get1D()), Hash(sampler.Get1D()));
            ray.medium.SampleTmaj(ray, tMax, rng, lambda, [&](const MediumSample &ms) {
                // Update delta-tracking estimator for path sample
                if (!ms.intr)
                    return false;
                const MediumInteraction &intr = *ms.intr;
                const SampledSpectrum &sigma_a = intr.sigma_a, &sigma_s = intr.sigma_s;
                // Compute medium event probabilities for interaction
                Float pAbsorb = sigma_a[0] / intr.sigma_maj[0];
                Float pScatter = sigma_s[0] / intr.sigma_maj[0];
                Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                // Randomly sample medium scattering event for delta-tracking
                Float u = sampler.Get1D();
                int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, u);
                if (mode == 0) {
                    // Handle absorption event for delta-tracking
                    // absorbed; done
                    L += SafeDiv(intr.Le, lambda.PDF());
                    terminated = true;
                    return false;

                } else if (mode == 1) {
                    // Handle scattering event for delta-tracking
                    if (numScatters++ >= maxDepth) {
                        terminated = true;
                        return false;
                    }
                    Vector3f wi = SampleUniformSphere(sampler.Get2D());
                    beta *= intr.phase.p(-ray.d, wi) / UniformSpherePDF();
                    ray = intr.SpawnRay(wi);
                    scattered = true;
                    return false;

                } else {
                    // Handle null scattering event for delta-tracking
                    // null -- keep going...
                    return true;
                }
            });
        }
        if (terminated)
            break;
        if (!scattered) {
            // Add emission to un-scattered ray
            if (!si) {
                for (const auto &light : infiniteLights)
                    L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
                return L;
            }
            SurfaceInteraction &isect = si->intr;
            L += SafeDiv(beta * isect.Le(-ray.d, lambda), lambda.PDF());

            // Handle surface intersection for _SimpleVolPathIntegrator_
            BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
            if (!bsdf)
                isect.SkipIntersection(&ray, si->tHit);
            else if (bsdf.Sample_f(-ray.d, sampler.Get1D(), sampler.Get2D()))
                ErrorExit(
                    "SimpleVolPathIntegrator doesn't support scattering from surfaces");
            else
                break;
        }
    }
    return L;
}